

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  uint8_t *__s;
  uint8_t uVar1;
  uint8_t uVar2;
  void *pvVar3;
  int iVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  
  puVar5 = *src;
  iVar4 = 0x32;
  if (1 < (ulong)((long)end - (long)puVar5)) {
    *src = puVar5 + 1;
    uVar1 = *puVar5;
    puVar7 = puVar5 + 2;
    *src = puVar7;
    uVar6 = (ulong)CONCAT11(uVar1,puVar5[1]);
    if ((uVar6 <= (ulong)((long)end - (long)puVar7)) && (uVar6 != 0)) {
      puVar5 = puVar5 + 1 + uVar6 + 1;
      do {
        *src = puVar7 + 1;
        if ((ulong)((long)puVar5 - (long)(puVar7 + 1)) < 2) {
          return 0x32;
        }
        uVar1 = *puVar7;
        *src = puVar7 + 2;
        uVar2 = puVar7[1];
        __s = puVar7 + 3;
        *src = __s;
        uVar6 = (ulong)CONCAT11(uVar2,puVar7[2]);
        if ((ulong)((long)puVar5 - (long)__s) < uVar6) {
          return 0x32;
        }
        if (uVar1 == '\0') {
          pvVar3 = memchr(__s,0,uVar6);
          if (pvVar3 != (void *)0x0) {
            return 0x2f;
          }
          name->base = __s;
          name->len = uVar6;
        }
        puVar7 = __s + uVar6;
        *src = puVar7;
      } while (puVar7 != puVar5);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *(*src)++;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}